

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Lookup.cpp
# Opt level: O2

u64 __thiscall idx2::GetLinearBrick(idx2 *this,idx2_file *Idx2,int Level,v3i Brick3)

{
  long lVar1;
  byte bVar2;
  u64 uVar3;
  byte bVar4;
  undefined4 in_register_00000014;
  ulong uVar5;
  long lVar6;
  uint auStack_370 [212];
  code *pcStack_20;
  undefined8 local_10;
  undefined4 local_8;
  
  local_10 = CONCAT44(in_register_00000014,Level);
  local_8 = Brick3.field_0._0_4_;
  lVar1 = *(long *)(this + 0x640) + (long)(int)Idx2 * 0x81;
  bVar2 = *(byte *)(lVar1 + 0x80);
  bVar4 = 0;
  uVar3 = 0;
  uVar5 = (ulong)bVar2;
  while( true ) {
    if (uVar5 == 0) {
      return uVar3;
    }
    if (0x80 < bVar2) break;
    lVar6 = (long)*(char *)(lVar1 + -1 + uVar5);
    if (0x5a < lVar6) {
      pcStack_20 = (code *)0x163df1;
      __assert_fail("Idx < 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
    }
    uVar3 = uVar3 | (ulong)(auStack_370[lVar6 + 0x80] & 1) << (bVar4 & 0x3f);
    auStack_370[lVar6 + 0x80] = (int)auStack_370[lVar6 + 0x80] >> 1;
    bVar4 = bVar4 + 1;
    uVar5 = uVar5 - 1;
  }
  pcStack_20 = GetSpatialBrick;
  __assert_fail("Idx < N",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                ,0x237,"char &idx2::stack_string<128>::operator[](int) const [N = 128]");
}

Assistant:

u64
GetLinearBrick(const idx2_file& Idx2, int Level, v3i Brick3)
{
  u64 LinearBrick = 0;
  int Size = Idx2.BricksOrderStr[Level].Len;
  for (int I = Size - 1; I >= 0; --I)
  {
    int D = Idx2.BricksOrderStr[Level][I] - 'X';
    LinearBrick |= (Brick3[D] & u64(1)) << (Size - I - 1);
    Brick3[D] >>= 1;
  }
  return LinearBrick;
}